

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O0

void __thiscall LineReader<true>::iterator::iterator(iterator *this,File *f,ssize_t offset)

{
  string local_50;
  long local_20;
  ssize_t offset_local;
  File *f_local;
  iterator *this_local;
  
  this->f_ = f;
  this->offset_ = offset;
  local_20 = offset;
  offset_local = (ssize_t)f;
  f_local = (File *)this;
  std::__cxx11::string::string((string *)&this->line);
  if (-1 < local_20) {
    File::seek((File *)offset_local,local_20,0);
  }
  File::readLine_abi_cxx11_(&local_50,(File *)offset_local);
  std::__cxx11::string::operator=((string *)&this->line,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

iterator(File& f, ssize_t offset) : f_(f), offset_(offset)
        {
            if (offset >= 0)
                f.seek(offset);
            line = f.readLine();
        }